

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O2

int evfilt_write_knote_modify(filter *filt,knote *kn,kevent *kev)

{
  if ((kn->kn_flags & 1) == 0) {
    return (int)(short)(((kev->flags >> 5 & 1) != 0) - 1);
  }
  return -1;
}

Assistant:

int
evfilt_write_knote_modify(UNUSED struct filter *filt, struct knote *kn,
        const struct kevent *kev)
{
    if (!(kn->kn_flags & KNFL_FILE)) {
        /*
         * This should reset the EOF sate of the socket.
         * but it's not even clear what that really means.
         *
         * With the native kqueue implementations it
         * basically does nothing.
         */
        if ((kev->flags & EV_CLEAR))
            return (0);
        return (-1);
    }

    return (-1);
}